

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O2

void __thiscall Fl_FLTK_File_Chooser::parse_filter(Fl_FLTK_File_Chooser *this)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  char cVar6;
  char *__s;
  char wildcard [1024];
  char name [1024];
  char comp [2048];
  
  strfree(this->_parsedfilt);
  this->_parsedfilt = (char *)0x0;
  this->_nfilters = 0;
  __s = this->_filter;
  if (__s == (char *)0x0) {
    return;
  }
  pcVar1 = strchr(__s,9);
  cVar5 = (pcVar1 == (char *)0x0) * '\t' + 'n';
  memset(wildcard,0,0x400);
  memset(name,0,0x400);
  pcVar1 = (char *)0x0;
  do {
    cVar6 = *__s;
    if (cVar6 == '\0') {
LAB_001c01c2:
      if (wildcard[0] != '\0') {
        pcVar4 = "\t";
        if (pcVar1 == (char *)0x0) {
          pcVar4 = "";
        }
        sprintf(comp,"%s%.511s(%.511s)",pcVar4,name,wildcard);
        pcVar4 = this->_parsedfilt;
        if (pcVar4 == (char *)0x0) {
          pcVar1 = strnew(comp);
        }
        else {
          sVar2 = strlen(pcVar4);
          sVar3 = strlen(comp);
          pcVar1 = (char *)operator_new__(sVar2 + sVar3 + 1);
          strcpy(pcVar1,pcVar4);
          strcat(pcVar1,comp);
          operator_delete__(pcVar4);
        }
        this->_parsedfilt = pcVar1;
        this->_nfilters = this->_nfilters + 1;
        cVar6 = *__s;
      }
      name[0] = '\0';
      wildcard[0] = '\0';
      pcVar4 = strchr(__s,9);
      if (cVar6 == '\0') {
        return;
      }
      cVar5 = (pcVar4 == (char *)0x0) * '\t' + 'n';
    }
    else if (cVar6 == '\\') {
      __s = __s + 1;
LAB_001c0253:
      pcVar4 = name;
      if ((cVar5 == 'n') || (pcVar4 = wildcard, cVar5 == 'w')) {
        chrcat(pcVar4,*__s);
      }
    }
    else {
      if ((cVar6 == '\n') || (cVar6 == '\r')) goto LAB_001c01c2;
      if ((cVar6 != '\t') || (cVar5 != 'n')) goto LAB_001c0253;
      cVar5 = 'w';
    }
    __s = __s + 1;
  } while( true );
}

Assistant:

void Fl_FLTK_File_Chooser::parse_filter() {
  _parsedfilt = strfree(_parsedfilt);	// clear previous parsed filter (if any)
  _nfilters = 0;
  char *in = _filter;
  if ( !in ) return;

  int has_name = strchr(in, '\t') ? 1 : 0;

  char mode = has_name ? 'n' : 'w';	// parse mode: n=title, w=wildcard
  char wildcard[1024] = "";		// parsed wildcard
  char name[1024] = "";

  // Parse filter user specified
  for ( ; 1; in++ ) {
    /*** DEBUG
    printf("WORKING ON '%c': mode=<%c> name=<%s> wildcard=<%s>\n",
			*in, mode,     name,     wildcard);
    ***/

    switch (*in) {
      // FINISHED PARSING NAME?
      case '\t':
        if ( mode != 'n' ) goto regchar;
        mode = 'w';
        break; 
      // ESCAPE NEXT CHAR
      case '\\':
	++in;
	goto regchar; 
      // FINISHED PARSING ONE OF POSSIBLY SEVERAL FILTERS?
      case '\r':
      case '\n':
      case '\0':
	// APPEND NEW FILTER TO LIST
	if ( wildcard[0] ) {
	  // OUT: "name(wild)\tname(wild)"
	  char comp[2048];
	  sprintf(comp, "%s%.511s(%.511s)", ((_parsedfilt)?"\t":""),
					    name, wildcard);
	  _parsedfilt = strapp(_parsedfilt, comp);
	  _nfilters++;
	  //DEBUG printf("DEBUG: PARSED FILT NOW <%s>\n", _parsedfilt);
	}
	// RESET
	wildcard[0] = name[0] = '\0';
	mode = strchr(in, '\t') ? 'n' : 'w';
	// DONE?
	if ( *in == '\0' ) return;	// done
	else continue;			// not done yet, more filters

      // Parse all other chars
      default:				// handle all non-special chars
      regchar:				// handle regular char
	switch ( mode ) {
	  case 'n': chrcat(name, *in);     continue;
	  case 'w': chrcat(wildcard, *in); continue;
	}
	break;
    }
  }
  //NOTREACHED
}